

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O3

void us_internal_dispatch_ready_poll(us_poll_t *p,int error,int events)

{
  us_poll_t *puVar1;
  long *plVar2;
  us_loop_t *puVar3;
  uint uVar4;
  int iVar5;
  ssize_t sVar6;
  us_socket_context_t *puVar7;
  us_socket_t *s_00;
  int *piVar8;
  us_socket_t *s;
  bsd_addr_t addr;
  undefined4 local_cc;
  sockaddr local_c8 [8];
  socklen_t local_48 [2];
  char *local_40;
  undefined4 local_38;
  
  uVar4 = us_internal_poll_type(p);
  if (uVar4 < 2) {
    if (error != 0) goto LAB_001054ca;
    if ((events & 4U) != 0) {
      plVar2 = *(long **)(p + 1);
      *(undefined4 *)(*plVar2 + 0x10) = 0;
      p = (us_poll_t *)(*(code *)plVar2[7])();
      iVar5 = us_socket_is_closed(0,(us_socket_t *)p);
      if (iVar5 != 0) {
        return;
      }
      if (((((us_socket_t *)p)->context->loop->data).last_write_failed == 0) ||
         (iVar5 = us_socket_is_shut_down(0,(us_socket_t *)p), iVar5 != 0)) {
        puVar7 = us_socket_context(0,(us_socket_t *)p);
        puVar3 = puVar7->loop;
        uVar4 = us_poll_events(p);
        us_poll_change(p,puVar3,uVar4 & 1);
      }
    }
    if (((events & 1U) != 0) &&
       (iVar5 = (*((us_socket_t *)p)->context->ignore_data)((us_socket_t *)p), iVar5 == 0)) {
      iVar5 = us_poll_fd(p);
      sVar6 = recv(iVar5,(((us_socket_t *)p)->context->loop->data).recv_buf + 0x20,0x80000,0);
      iVar5 = (int)sVar6;
      if (0 < iVar5) {
        (*((us_socket_t *)p)->context->on_data)
                  ((us_socket_t *)p,(((us_socket_t *)p)->context->loop->data).recv_buf + 0x20,iVar5)
        ;
        return;
      }
      if (iVar5 == -1) {
        piVar8 = __errno_location();
        if (*piVar8 != 0xb) goto LAB_001054ca;
      }
      else if (iVar5 == 0) {
        iVar5 = us_socket_is_shut_down(0,(us_socket_t *)p);
        if (iVar5 == 0) {
          puVar7 = us_socket_context(0,(us_socket_t *)p);
          puVar3 = puVar7->loop;
          uVar4 = us_poll_events(p);
          us_poll_change(p,puVar3,uVar4 & 4);
          (*((us_socket_t *)p)->context->on_end)((us_socket_t *)p);
          return;
        }
LAB_001054ca:
        us_socket_close(0,(us_socket_t *)p);
        return;
      }
    }
  }
  else if (uVar4 == 2) {
    iVar5 = us_poll_events(p);
    if (iVar5 == 4) {
      us_poll_change(p,(us_loop_t *)**(undefined8 **)(p + 1),1);
      iVar5 = us_poll_fd(p);
      local_c8[0].sa_family = 1;
      local_c8[0].sa_data[0] = '\0';
      local_c8[0].sa_data[1] = '\0';
      setsockopt(iVar5,6,1,local_c8,4);
      us_internal_poll_set_type(p,0);
      (**(code **)(*(long *)(p + 1) + 0x28))(p,1,0,0);
    }
    else {
      iVar5 = us_poll_fd(p);
      local_48[0] = 0x80;
      iVar5 = accept4(iVar5,local_c8,local_48,0x80800);
      if ((local_c8[0]._0_4_ & 0xffff) == 10) {
        local_38 = 0x10;
        local_40 = local_c8[0].sa_data + 6;
      }
      else {
        local_38 = 0;
        if ((local_c8[0]._0_4_ & 0xffff) == 2) {
          local_38 = 4;
          local_40 = local_c8[0].sa_data + 2;
        }
      }
      uVar4 = fcntl(iVar5,3,0);
      fcntl(iVar5,4,(ulong)(uVar4 | 0x800));
      if (iVar5 != -1) {
        do {
          puVar7 = us_socket_context(0,(us_socket_t *)p);
          s_00 = (us_socket_t *)us_create_poll(puVar7->loop,0,(int)p[3].state + 0x20);
          us_poll_init((us_poll_t *)s_00,iVar5,0);
          us_poll_start((us_poll_t *)s_00,(us_loop_t *)**(undefined8 **)(p + 1),1);
          s_00->context = *(us_socket_context_t **)(p + 1);
          local_cc = 1;
          setsockopt(iVar5,6,1,&local_cc,4);
          us_internal_socket_context_link(*(us_socket_context_t **)(p + 1),s_00);
          (**(code **)(*(long *)(p + 1) + 0x28))(s_00,0,local_40,local_38);
          iVar5 = us_socket_is_closed(0,(us_socket_t *)p);
          if (iVar5 != 0) {
            return;
          }
          iVar5 = us_poll_fd(p);
          local_48[0] = 0x80;
          iVar5 = accept4(iVar5,local_c8,local_48,0x80800);
          if ((local_c8[0]._0_4_ & 0xffff) == 10) {
            local_38 = 0x10;
            local_40 = local_c8[0].sa_data + 6;
          }
          else {
            local_38 = 0;
            if ((local_c8[0]._0_4_ & 0xffff) == 2) {
              local_38 = 4;
              local_40 = local_c8[0].sa_data + 2;
            }
          }
          uVar4 = fcntl(iVar5,3,0);
          fcntl(iVar5,4,(ulong)(uVar4 | 0x800));
        } while (iVar5 != -1);
      }
    }
  }
  else if (uVar4 == 3) {
    us_internal_accept_poll_event(p);
    puVar1 = p + 2;
    if (*(int *)&p[1].field_0x8 != 0) {
      p = *(us_poll_t **)(p + 1);
    }
    (**(code **)puVar1)(p);
    return;
  }
  return;
}

Assistant:

void us_internal_dispatch_ready_poll(struct us_poll_t *p, int error, int events) {
    switch (us_internal_poll_type(p)) {
    case POLL_TYPE_CALLBACK: {
            us_internal_accept_poll_event(p);
            struct us_internal_callback_t *cb = (struct us_internal_callback_t *) p;
            cb->cb(cb->cb_expects_the_loop ? (struct us_internal_callback_t *) cb->loop : (struct us_internal_callback_t *) &cb->p);
        }
        break;
    case POLL_TYPE_SEMI_SOCKET: {
            /* Both connect and listen sockets are semi-sockets
             * but they poll for different events */
            if (us_poll_events(p) == LIBUS_SOCKET_WRITABLE) {
                struct us_socket_t *s = (struct us_socket_t *) p;

                us_poll_change(p, s->context->loop, LIBUS_SOCKET_READABLE);

                /* We always use nodelay */
                bsd_socket_nodelay(us_poll_fd(p), 1);

                /* We are now a proper socket */
                us_internal_poll_set_type(p, POLL_TYPE_SOCKET);

                s->context->on_open(s, 1, 0, 0);
            } else {
                struct us_listen_socket_t *listen_socket = (struct us_listen_socket_t *) p;
                struct bsd_addr_t addr;

                LIBUS_SOCKET_DESCRIPTOR client_fd = bsd_accept_socket(us_poll_fd(p), &addr);
                if (client_fd == LIBUS_SOCKET_ERROR) {
                    /* Todo: start timer here */

                } else {

                    /* Todo: stop timer if any */

                    do {
                        struct us_poll_t *accepted_p = us_create_poll(us_socket_context(0, &listen_socket->s)->loop, 0, sizeof(struct us_socket_t) - sizeof(struct us_poll_t) + listen_socket->socket_ext_size);
                        us_poll_init(accepted_p, client_fd, POLL_TYPE_SOCKET);
                        us_poll_start(accepted_p, listen_socket->s.context->loop, LIBUS_SOCKET_READABLE);

                        struct us_socket_t *s = (struct us_socket_t *) accepted_p;

                        s->context = listen_socket->s.context;

                        /* We always use nodelay */
                        bsd_socket_nodelay(client_fd, 1);

                        us_internal_socket_context_link(listen_socket->s.context, s);

                        listen_socket->s.context->on_open(s, 0, bsd_addr_get_ip(&addr), bsd_addr_get_ip_length(&addr));

                        /* Exit accept loop if listen socket was closed in on_open handler */
                        if (us_socket_is_closed(0, &listen_socket->s)) {
                            break;
                        }

                    } while ((client_fd = bsd_accept_socket(us_poll_fd(p), &addr)) != LIBUS_SOCKET_ERROR);
                }
            }
        }
        break;
    case POLL_TYPE_SOCKET_SHUT_DOWN:
    case POLL_TYPE_SOCKET: {
            /* We should only use s, no p after this point */
            struct us_socket_t *s = (struct us_socket_t *) p;

            /* Such as epollerr epollhup */
            if (error) {
                s = us_socket_close(0, s);
                return;
            }

            if (events & LIBUS_SOCKET_WRITABLE) {
                /* Note: if we failed a write as a socket of one loop then adopted
                 * to another loop, this will be wrong. Absurd case though */
                s->context->loop->data.last_write_failed = 0;

                s = s->context->on_writable(s);

                if (us_socket_is_closed(0, s)) {
                    return;
                }

                /* If we have no failed write or if we shut down, then stop polling for more writable */
                if (!s->context->loop->data.last_write_failed || us_socket_is_shut_down(0, s)) {
                    us_poll_change(&s->p, us_socket_context(0, s)->loop, us_poll_events(&s->p) & LIBUS_SOCKET_READABLE);
                }
            }

            if (events & LIBUS_SOCKET_READABLE) {
                /* Contexts may ignore data and postpone it to next iteration, for balancing purposes such as
                 * when SSL handshakes take too long to finish and we only want a few of them per iteration */
                if (s->context->ignore_data(s)) {
                    break;
                }

                int length = bsd_recv(us_poll_fd(&s->p), s->context->loop->data.recv_buf + LIBUS_RECV_BUFFER_PADDING, LIBUS_RECV_BUFFER_LENGTH, 0);
                if (length > 0) {
                    s = s->context->on_data(s, s->context->loop->data.recv_buf + LIBUS_RECV_BUFFER_PADDING, length);
                } else if (!length) {
                    if (us_socket_is_shut_down(0, s)) {
                        /* We got FIN back after sending it */
                        s = us_socket_close(0, s);
                    } else {
                        /* We got FIN, so stop polling for readable */
                        us_poll_change(&s->p, us_socket_context(0, s)->loop, us_poll_events(&s->p) & LIBUS_SOCKET_WRITABLE);
                        s = s->context->on_end(s);
                    }
                } else if (length == LIBUS_SOCKET_ERROR && !bsd_would_block()) {
                    s = us_socket_close(0, s);
                }
            }
        }
        break;
    }
}